

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_message.h
# Opt level: O0

message<MsgType> *
blcl::net::operator>>
          (message<MsgType> *msg,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *data)

{
  size_type sVar1;
  uchar *puVar2;
  size_t sVar3;
  size_t i;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *data_local;
  message<MsgType> *msg_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&msg->body);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&msg->body);
  (data->__d).__r = *(rep_conflict *)(puVar2 + (sVar1 - 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&msg->body,sVar1 - 8);
  sVar3 = message<MsgType>::size(msg);
  (msg->header).size = (uint32_t)sVar3;
  return msg;
}

Assistant:

message<T>& operator>>(message<T>& msg, Data& data) {
            static_assert(std::is_standard_layout<Data>::value,
                          "Type of data is not in standard layout thus not able to be deserialized.");

            size_t i = msg.body.size() - sizeof(Data);
            // Copy the data from the vector to the variable
            std::memcpy(&data, msg.body.data() + i, sizeof(Data));
            // Resize the vector, shrink the vector size by read-out bytes, and reset the end position
            msg.body.resize(i);
            // Recalculate msg size
            msg.header.size = msg.size();

            // Return the resulting msg so that it could be chain-called.
            return msg;
        }